

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

ActionResultHolder<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_> *
testing::internal::ActionResultHolder<std::unique_ptr<SDL_Window,std::function<void(SDL_Window*)>>>
::
PerformAction<std::unique_ptr<SDL_Window,std::function<void(SDL_Window*)>>(std::__cxx11::string_const&,int,int,int,int,unsigned_int)>
          (Action<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int,_int,_int,_unsigned_int)>
           *action,ArgumentTuple *args)

{
  ActionResultHolder<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_> *this;
  __uniq_ptr_impl<SDL_Window,_std::function<void_(SDL_Window_*)>_> local_90;
  _Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int,_int,_int,_unsigned_int>
  local_68;
  __uniq_ptr_impl<SDL_Window,_std::function<void_(SDL_Window_*)>_> local_48;
  
  this = (ActionResultHolder<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_> *)
         operator_new(0x30);
  std::
  _Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int,_int,_int,_unsigned_int>
  ::_Tuple_impl(&local_68,
                &args->
                 super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int,_int,_int,_unsigned_int>
               );
  Action<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int,_int,_int,_unsigned_int)>
  ::Perform((Result *)&local_90,action,(ArgumentTuple *)&local_68);
  std::__uniq_ptr_impl<SDL_Window,_std::function<void_(SDL_Window_*)>_>::__uniq_ptr_impl
            (&local_48,&local_90);
  ActionResultHolder<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_>::
  ActionResultHolder(this,(Wrapper *)&local_48);
  std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>::~unique_ptr
            ((unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_> *)&local_48);
  std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>::~unique_ptr
            ((unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_> *)&local_90);
  return this;
}

Assistant:

static ActionResultHolder* PerformAction(
      const Action<F>& action, typename Function<F>::ArgumentTuple&& args) {
    return new ActionResultHolder(
        Wrapper(action.Perform(std::move(args))));
  }